

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

int64 google::Int64FromEnv(char *v,int64 dflt)

{
  bool bVar1;
  void *valbuf;
  FlagValue ifv;
  string valstr;
  
  valstr._M_dataplus._M_p = (pointer)&valstr.field_2;
  valstr._M_string_length = 0;
  valstr.field_2._M_local_buf[0] = '\0';
  bVar1 = SafeGetEnv(v,&valstr);
  if (bVar1) {
    valbuf = operator_new(8);
    anon_unknown_1::FlagValue::FlagValue(&ifv,valbuf,"int64",true);
    bVar1 = anon_unknown_1::FlagValue::ParseFrom(&ifv,valstr._M_dataplus._M_p);
    if (!bVar1) {
      anon_unknown_1::ReportError
                (DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",v,
                 valstr._M_dataplus._M_p);
    }
    dflt = *ifv.value_buffer_;
    anon_unknown_1::FlagValue::~FlagValue(&ifv);
  }
  std::__cxx11::string::~string((string *)&valstr);
  return dflt;
}

Assistant:

int64 Int64FromEnv(const char *v, int64 dflt)    {
  return GetFromEnv(v, "int64", dflt);
}